

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3FindDbName(sqlite3 *db,char *zName)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Db *pDVar4;
  ulong uVar5;
  
  uVar3 = 0xffffffff;
  if (zName != (char *)0x0) {
    uVar3 = db->nDb - 1;
    uVar5 = (ulong)uVar3;
    if (0 < db->nDb) {
      pDVar4 = db->aDb + uVar5;
      do {
        iVar2 = (int)uVar5;
        if ((pDVar4->zDbSName != (char *)0x0) &&
           (iVar1 = sqlite3StrICmp(pDVar4->zDbSName,zName), iVar1 == 0)) {
          return iVar2;
        }
        uVar5 = (ulong)(iVar2 - 1);
        if (iVar2 == 0) {
          iVar2 = sqlite3StrICmp("main",zName);
          return -(uint)(iVar2 != 0);
        }
        pDVar4 = pDVar4 + -1;
        uVar3 = 0xffffffff;
      } while (0 < iVar2);
    }
  }
  return uVar3;
}

Assistant:

SQLITE_PRIVATE int sqlite3FindDbName(sqlite3 *db, const char *zName){
  int i = -1;         /* Database number */
  if( zName ){
    Db *pDb;
    for(i=(db->nDb-1), pDb=&db->aDb[i]; i>=0; i--, pDb--){
      if( 0==sqlite3_stricmp(pDb->zDbSName, zName) ) break;
      /* "main" is always an acceptable alias for the primary database
      ** even if it has been renamed using SQLITE_DBCONFIG_MAINDBNAME. */
      if( i==0 && 0==sqlite3_stricmp("main", zName) ) break;
    }
  }
  return i;
}